

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filescan.cc
# Opt level: O0

RC __thiscall RM_FileScan::GetNumRecOnPage(RM_FileScan *this,PF_PageHandle *ph,int *numRecords)

{
  RM_PageHeader *local_40;
  RM_PageHeader *pageheader;
  char *bitmap;
  int *piStack_28;
  RC rc;
  int *numRecords_local;
  PF_PageHandle *ph_local;
  RM_FileScan *this_local;
  
  piStack_28 = numRecords;
  numRecords_local = &ph->pageNum;
  ph_local = (PF_PageHandle *)this;
  this_local._4_4_ =
       RM_FileHandle::GetPageDataAndBitmap(this->fileHandle,ph,(char **)&pageheader,&local_40);
  if (this_local._4_4_ == 0) {
    *piStack_28 = local_40->numRecords;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC RM_FileScan::GetNumRecOnPage(PF_PageHandle &ph, int &numRecords){
  RC rc;
  char *bitmap;
  struct RM_PageHeader *pageheader;
  if((rc = (this->fileHandle)->GetPageDataAndBitmap(ph, bitmap, pageheader)))
      return (rc);
  numRecords = pageheader->numRecords;
  return (0);
}